

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::TParseContext::vkRelaxedRemapUniformVariable
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TPublicType *publicType,
          TArraySizes *param_4,TIntermTyped *initializer,TType *type)

{
  TString *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  mapped_type *ppTVar7;
  TSymbol *pTVar8;
  undefined4 extraout_var_11;
  TQualifier *dst;
  undefined4 extraout_var_12;
  TSymbol *symbol;
  mapped_type local_50;
  TVariable *updatedBlock;
  TIntermTyped *pTStack_40;
  int bufferBinding;
  TIntermTyped *initializer_local;
  TArraySizes *param_4_local;
  TPublicType *publicType_local;
  TString *identifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  pTStack_40 = initializer;
  initializer_local = (TIntermTyped *)param_4;
  param_4_local = (TArraySizes *)publicType;
  publicType_local = (TPublicType *)identifier;
  identifier_local = (TString *)loc;
  loc_local = (TSourceLoc *)this;
  vkRelaxedRemapUniformMembers(this,loc,publicType,type,identifier);
  if (((((((this->super_TParseContextBase).parsingBuiltins & 1U) != 0) ||
        (bVar2 = TSymbolTable::atBuiltInLevel((this->super_TParseContextBase).symbolTable), bVar2))
       || (bVar2 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable), !bVar2)
       ) || (iVar3 = (*type->_vptr_TType[10])(),
            ((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar3) + 8) & 0x7f) != 5)) ||
     (((uVar4 = (*type->_vptr_TType[0x39])(), (uVar4 & 1) == 0 &&
       (iVar3 = (*type->_vptr_TType[7])(), iVar3 != 0xd)) &&
      ((uVar4 = (*type->_vptr_TType[0x37])(), (uVar4 & 1) == 0 ||
       (uVar4 = (*type->_vptr_TType[0x25])(), (uVar4 & 1) == 0)))))) {
    this_local._7_1_ = false;
  }
  else {
    iVar3 = (*type->_vptr_TType[10])();
    bVar2 = TQualifier::hasLocation((TQualifier *)CONCAT44(extraout_var_00,iVar3));
    pTVar1 = identifier_local;
    if (bVar2) {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)publicType_local);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,pTVar1,"ignoring layout qualifier for uniform",pcVar6,"location");
      iVar3 = (*type->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_01,iVar3) + 0x1c) =
           *(ulong *)(CONCAT44(extraout_var_01,iVar3) + 0x1c) & 0xfffffffffffff000 | 0xfff;
    }
    pTVar1 = identifier_local;
    if (pTStack_40 != (TIntermTyped *)0x0) {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)publicType_local);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,pTVar1,"Ignoring initializer for uniform",pcVar6,"");
      pTStack_40 = (TIntermTyped *)0x0;
    }
    uVar4 = (*type->_vptr_TType[0x1d])();
    pTVar1 = identifier_local;
    if ((uVar4 & 1) != 0) {
      iVar3 = (*type->_vptr_TType[10])();
      iVar5 = (*type->_vptr_TType[0x14])();
      arraySizesCheck(this,(TSourceLoc *)pTVar1,(TQualifier *)CONCAT44(extraout_var_02,iVar3),
                      (TArraySizes *)CONCAT44(extraout_var_03,iVar5),pTStack_40,false);
      pTVar1 = identifier_local;
      iVar3 = (*type->_vptr_TType[10])();
      bVar2 = arrayQualifierError(this,(TSourceLoc *)pTVar1,
                                  (TQualifier *)CONCAT44(extraout_var_04,iVar3));
      if ((bVar2) || (bVar2 = arrayError(this,(TSourceLoc *)identifier_local,type), bVar2)) {
        pTVar1 = identifier_local;
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)publicType_local);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"array param error",pcVar6,"");
      }
    }
    layoutTypeCheck(this,(TSourceLoc *)identifier_local,type);
    updatedBlock._4_4_ = 0xffff;
    local_50 = (mapped_type)0x0;
    bVar2 = TType::isAtomic(type);
    if (bVar2) {
      symbol._4_4_ = 9;
      TType::setBasicType(type,(TBasicType *)((long)&symbol + 4));
      iVar3 = (*type->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_05,iVar3) + 8) =
           *(ulong *)(CONCAT44(extraout_var_05,iVar3) + 8) & 0xffffffffffffff80 | 6;
      iVar3 = (*type->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_06,iVar3) + 8) =
           *(ulong *)(CONCAT44(extraout_var_06,iVar3) + 8) & 0xfffbffffffffffff | 0x4000000000000;
      iVar3 = (*type->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_07,iVar3) + 8) =
           *(ulong *)(CONCAT44(extraout_var_07,iVar3) + 8) & 0xfffdffffffffffff | 0x2000000000000;
      iVar3 = (*type->_vptr_TType[10])();
      updatedBlock._4_4_ =
           (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_08,iVar3) + 0x1c) >> 0x20) & 0xffff;
      iVar3 = (*type->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_09,iVar3) + 0x1c) =
           *(ulong *)(CONCAT44(extraout_var_09,iVar3) + 0x1c) & 0xffff0000ffffffff | 0xffff00000000;
      iVar3 = (*type->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_10,iVar3) + 8) =
           *(ulong *)(CONCAT44(extraout_var_10,iVar3) + 8) & 0xfffffffbffffffff;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x41])
                (this,(ulong)updatedBlock._4_4_,identifier_local,type,publicType_local,0);
      ppTVar7 = std::
                map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
                ::operator[](&(this->super_TParseContextBase).atomicCounterBuffers.
                              super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
                             ,(key_type_conflict1 *)((long)&updatedBlock + 4));
      local_50 = *ppTVar7;
    }
    if (local_50 == (mapped_type)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x40])
                (this,identifier_local,type,publicType_local,0);
      local_50 = (this->super_TParseContextBase).globalUniformBlock;
    }
    layoutObjectCheck(this,(TSourceLoc *)identifier_local,&local_50->super_TSymbol);
    pTVar8 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,
                                (TString *)publicType_local,(bool *)0x0,(bool *)0x0,(int *)0x0);
    pTVar1 = identifier_local;
    if (pTVar8 == (TSymbol *)0x0) {
      if (local_50 == (this->super_TParseContextBase).globalUniformBlock) {
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)publicType_local);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"error adding uniform to default uniform block",pcVar6,"");
      }
      else {
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)publicType_local);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"error adding atomic counter to atomic counter block",pcVar6,"");
      }
      this_local._7_1_ = false;
    }
    else {
      iVar3 = (*(local_50->super_TSymbol)._vptr_TSymbol[0xd])();
      dst = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_11,iVar3) + 0x50))();
      iVar3 = (*type->_vptr_TType[10])();
      mergeObjectLayoutQualifiers(this,dst,(TQualifier *)CONCAT44(extraout_var_12,iVar3),true);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TParseContext::vkRelaxedRemapUniformVariable(const TSourceLoc& loc, TString& identifier, const TPublicType& publicType,
    TArraySizes*, TIntermTyped* initializer, TType& type)
{
    vkRelaxedRemapUniformMembers(loc, publicType, type, identifier);

    if (parsingBuiltins || symbolTable.atBuiltInLevel() || !symbolTable.atGlobalLevel() ||
        type.getQualifier().storage != EvqUniform ||
        !(type.containsNonOpaque() || type.getBasicType() == EbtAtomicUint || (type.containsSampler() && type.isStruct()))) {
        return false;
    }

    if (type.getQualifier().hasLocation()) {
        warn(loc, "ignoring layout qualifier for uniform", identifier.c_str(), "location");
        type.getQualifier().layoutLocation = TQualifier::layoutLocationEnd;
    }

    if (initializer) {
        warn(loc, "Ignoring initializer for uniform", identifier.c_str(), "");
        initializer = nullptr;
    }

    if (type.isArray()) {
        // do array size checks here
        arraySizesCheck(loc, type.getQualifier(), type.getArraySizes(), initializer, false);

        if (arrayQualifierError(loc, type.getQualifier()) || arrayError(loc, type)) {
            error(loc, "array param error", identifier.c_str(), "");
        }
    }

    // do some checking on the type as it was declared
    layoutTypeCheck(loc, type);

    int bufferBinding = TQualifier::layoutBindingEnd;
    TVariable* updatedBlock = nullptr;

    // Convert atomic_uint into members of a buffer block
    if (type.isAtomic()) {
        type.setBasicType(EbtUint);
        type.getQualifier().storage = EvqBuffer;

        type.getQualifier().volatil = true;
        type.getQualifier().coherent = true;

        // xxTODO: use logic from fixOffset() to apply explicit member offset
        bufferBinding = type.getQualifier().layoutBinding;
        type.getQualifier().layoutBinding = TQualifier::layoutBindingEnd;
        type.getQualifier().explicitOffset = false;
        growAtomicCounterBlock(bufferBinding, loc, type, identifier, nullptr);
        updatedBlock = atomicCounterBuffers[bufferBinding];
    }

    if (!updatedBlock) {
        growGlobalUniformBlock(loc, type, identifier, nullptr);
        updatedBlock = globalUniformBlock;
    }

    //
    //      don't assign explicit member offsets here
    //      if any are assigned, need to be updated here and in the merge/link step
    // fixBlockUniformOffsets(updatedBlock->getWritableType().getQualifier(), *updatedBlock->getWritableType().getWritableStruct());

    // checks on update buffer object
    layoutObjectCheck(loc, *updatedBlock);

    TSymbol* symbol = symbolTable.find(identifier);

    if (!symbol) {
        if (updatedBlock == globalUniformBlock)
            error(loc, "error adding uniform to default uniform block", identifier.c_str(), "");
        else
            error(loc, "error adding atomic counter to atomic counter block", identifier.c_str(), "");
        return false;
    }

    // merge qualifiers
    mergeObjectLayoutQualifiers(updatedBlock->getWritableType().getQualifier(), type.getQualifier(), true);

    return true;
}